

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O1

void mserialize::detail::visit_struct<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  StructBegin sb;
  FieldBegin fb;
  bool bVar1;
  detail *pdVar2;
  detail *pdVar3;
  size_t sVar4;
  char *pcVar5;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  detail *pdVar6;
  detail *pdVar7;
  int iVar8;
  detail *pdVar9;
  long lVar10;
  detail *in_R11;
  detail *pdVar11;
  detail *pdVar12;
  detail *pdVar13;
  string_view tag_00;
  string_view tags;
  
  sVar4 = tag._len;
  pcVar5 = tag._ptr;
  pdVar7 = (detail *)full_tag._len;
  pdVar11 = (detail *)full_tag._ptr;
  pdVar6 = (detail *)(sVar4 - 1);
  if (sVar4 == 0) {
    pdVar6 = (detail *)0x0;
  }
  pdVar12 = (detail *)0x0;
  if (sVar4 != 0 && (detail *)(sVar4 - 1) != (detail *)0x0) {
    pdVar2 = (detail *)0x0;
    do {
      pdVar12 = pdVar2;
      if (pcVar5[(long)pdVar2] == '`') break;
      pdVar2 = pdVar2 + 1;
      pdVar12 = pdVar6;
    } while (pdVar6 != pdVar2);
  }
  pdVar2 = pdVar12;
  if (pdVar6 < pdVar12) {
    pdVar2 = pdVar6;
  }
  pdVar6 = pdVar6 + -(long)pdVar2;
  if (pdVar6 == (detail *)0x0) {
    if (pdVar12 != (detail *)0x0) {
      do {
        if (pdVar7 == (detail *)0x0) goto LAB_001094dc;
        pdVar9 = pdVar7;
        pdVar3 = pdVar11;
        do {
          pdVar13 = (detail *)0x0;
          do {
            if (pdVar9 == pdVar13) {
              bVar1 = false;
              in_R11 = pdVar11 + (long)pdVar7;
              goto LAB_00109436;
            }
            if (pdVar3[(long)pdVar13] != *(detail *)(pcVar5 + (long)pdVar13)) {
              bVar1 = true;
              goto LAB_00109436;
            }
            pdVar13 = pdVar13 + 1;
          } while (pdVar12 != pdVar13);
          bVar1 = false;
          in_R11 = pdVar3;
LAB_00109436:
          pdVar3 = pdVar3 + 1;
          pdVar9 = pdVar9 + -1;
        } while (bVar1);
        pdVar9 = in_R11 + -(long)pdVar11;
        if (in_R11 == pdVar11 + (long)pdVar7) {
          pdVar9 = (detail *)0xffffffffffffffff;
        }
        if (pdVar7 < pdVar9) {
          pdVar9 = pdVar7;
        }
        pdVar7 = pdVar7 + -(long)pdVar9;
        pdVar3 = pdVar12;
        if (pdVar7 < pdVar12) {
          pdVar3 = pdVar7;
        }
        pdVar11 = pdVar11 + (long)pdVar9 + (long)pdVar3;
        iVar8 = 3;
        pdVar7 = pdVar7 + -(long)pdVar3;
        if ((pdVar7 != (detail *)0x0) && (*pdVar11 != (detail)0x7d)) {
          if (*pdVar11 == (detail)0x60) {
            iVar8 = 1;
            pdVar2 = pdVar11;
            if (pdVar7 == (detail *)0x1) {
              pdVar6 = (detail *)0x0;
            }
            else {
              pdVar6 = (detail *)0x1;
              lVar10 = 1;
              do {
                if (pdVar11[(long)pdVar6] == (detail)0x7d) {
                  lVar10 = lVar10 + -1;
                  if (lVar10 == 0) goto LAB_001094cd;
                }
                else if (pdVar11[(long)pdVar6] == (detail)0x7b) {
                  lVar10 = lVar10 + 1;
                }
                pdVar6 = pdVar6 + 1;
              } while (pdVar7 != pdVar6);
              pdVar6 = pdVar7 + -1;
            }
          }
          else {
            iVar8 = 0;
          }
        }
LAB_001094cd:
      } while (iVar8 == 0);
      if (iVar8 == 1) goto LAB_001094e1;
    }
LAB_001094dc:
    pdVar6 = (detail *)0x0;
    pdVar2 = (detail *)0x0;
  }
  else {
    pdVar2 = pdVar2 + (long)pcVar5;
  }
LAB_001094e1:
  sb.name._len = (long)pdVar12 - (ulong)(pdVar12 != (detail *)0x0);
  sb.name._ptr = pcVar5 + (pdVar12 != (detail *)0x0);
  sb.tag._ptr = (char *)pdVar2;
  sb.tag._len = (size_t)pdVar6;
  bVar1 = binlog::ToStringVisitor::visit(visitor,sb,istream);
  sVar4 = extraout_RDX;
  if (bVar1) {
    return;
  }
  do {
    if (pdVar6 == (detail *)0x0) {
      binlog::ToStringVisitor::visit(visitor);
      return;
    }
    pdVar11 = pdVar2 + 1;
    pdVar12 = (detail *)0x0;
    pdVar6 = pdVar6 + -1;
    pdVar7 = pdVar12;
    if (pdVar6 != (detail *)0x0) {
      do {
        pdVar7 = pdVar12;
        if (pdVar11[(long)pdVar12] == (detail)0x27) break;
        pdVar12 = pdVar12 + 1;
        pdVar7 = pdVar6;
      } while (pdVar6 != pdVar12);
    }
    pdVar12 = pdVar7 + 1;
    if (pdVar6 < pdVar7 + 1) {
      pdVar12 = pdVar6;
    }
    pdVar9 = pdVar11 + (long)pdVar12;
    pdVar6 = pdVar6 + -(long)pdVar12;
    tags._len = sVar4;
    tags._ptr = (char *)pdVar6;
    pdVar3 = (detail *)tag_first_size(pdVar9,tags);
    pdVar12 = pdVar3;
    if (pdVar6 < pdVar3) {
      pdVar12 = pdVar6;
    }
    pdVar2 = pdVar9 + (long)pdVar12;
    fb.name._len = (size_t)pdVar7;
    fb.name._ptr = (char *)pdVar11;
    fb.tag._ptr = (char *)pdVar9;
    fb.tag._len = (size_t)pdVar3;
    binlog::ToStringVisitor::visit(visitor,fb);
    tag_00._len = (size_t)pdVar3;
    tag_00._ptr = (char *)pdVar9;
    visit_impl<binlog::ToStringVisitor,binlog::Range>(full_tag,tag_00,visitor,istream,max_recursion)
    ;
    binlog::ToStringVisitor::visit(visitor);
    pdVar6 = pdVar6 + -(long)pdVar12;
    sVar4 = extraout_RDX_00;
  } while( true );
}

Assistant:

void visit_struct(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_suffix(1); // drop }

  string_view intro = remove_prefix_before(tag, '`');

  if (tag.empty())
  {
    // perhaps a recursive struct?
    tag = resolve_recursive_tag(full_tag, intro);
  }

  intro.remove_prefix(1); // drop {

  const bool skip = visitor.visit(mserialize::Visitor::StructBegin{intro, tag}, istream);
  if (skip) { return; }

  while (! tag.empty())
  {
    const string_view field_name = tag_pop_label(tag);
    const string_view field_tag = tag_pop(tag);

    visitor.visit(mserialize::Visitor::FieldBegin{field_name, field_tag});

    visit_impl(full_tag, field_tag, visitor, istream, max_recursion);

    visitor.visit(mserialize::Visitor::FieldEnd{});
  }

  visitor.visit(mserialize::Visitor::StructEnd{});
}